

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

void __thiscall ParamListStandard::calcDelay(ParamListStandard *this)

{
  bool bVar1;
  int4 iVar2;
  reference this_00;
  AddrSpace *this_01;
  iterator iStack_38;
  int4 delay;
  _List_const_iterator<ParamEntry> local_30;
  iterator local_28;
  _List_const_iterator<ParamEntry> local_20;
  _List_const_iterator<ParamEntry> local_18;
  const_iterator iter;
  ParamListStandard *this_local;
  
  this->maxdelay = 0;
  iter._M_node = (_List_node_base *)this;
  std::_List_const_iterator<ParamEntry>::_List_const_iterator(&local_18);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::begin(&this->entry);
  std::_List_const_iterator<ParamEntry>::_List_const_iterator(&local_20,&local_28);
  local_18._M_node = local_20._M_node;
  while( true ) {
    iStack_38 = std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::end(&this->entry);
    std::_List_const_iterator<ParamEntry>::_List_const_iterator(&local_30,&stack0xffffffffffffffc8);
    bVar1 = std::operator!=(&local_18,&local_30);
    if (!bVar1) break;
    this_00 = std::_List_const_iterator<ParamEntry>::operator*(&local_18);
    this_01 = ParamEntry::getSpace(this_00);
    iVar2 = AddrSpace::getDelay(this_01);
    if (this->maxdelay < iVar2) {
      this->maxdelay = iVar2;
    }
    std::_List_const_iterator<ParamEntry>::operator++(&local_18);
  }
  return;
}

Assistant:

void ParamListStandard::calcDelay(void)

{
  maxdelay = 0;
  list<ParamEntry>::const_iterator iter;
  for(iter=entry.begin();iter!=entry.end();++iter) {
    int4 delay = (*iter).getSpace()->getDelay();
    if (delay > maxdelay)
      maxdelay = delay;
  }
}